

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

my_rational my_rational_construct(uint numerator,uint denominator)

{
  ulong uVar1;
  ulong uVar2;
  my_rational mVar3;
  ulong uVar4;
  uint t;
  
  if (denominator != 0) {
    if (numerator == 0) {
      mVar3.n = 0;
      mVar3.d = 1;
    }
    else {
      uVar2 = (ulong)numerator;
      uVar1 = (ulong)denominator;
      do {
        uVar4 = uVar1;
        uVar1 = uVar2 % uVar4;
        uVar2 = uVar4;
      } while ((int)uVar1 != 0);
      mVar3 = (my_rational)(numerator / uVar4 | denominator / uVar4 << 0x20);
    }
    return mVar3;
  }
  __assert_fail("denominator > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c",
                0x6a3,"struct my_rational my_rational_construct(unsigned int, unsigned int)");
}

Assistant:

struct my_rational my_rational_construct(unsigned int numerator,
		unsigned int denominator)
{
	struct my_rational result;

	assert(denominator > 0);
	if (numerator == 0) {
		/* Use 0 / 1 as the way to represent zero. */
		result.n = 0;
		result.d = 1;
	} else {
		unsigned int g = gcd(numerator, denominator);

		result.n = numerator / g;
		result.d = denominator / g;
	}
	return result;
}